

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<int>::initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
          (DArray<int> *this,IterTraits<Lib::RangeIterator<int>_> it,size_t count)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t s;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  uVar5 = it._iter._to;
  uVar6 = it._iter._0_8_;
  uVar7 = it._iter._next;
  if (count == 0) {
    ensure(this,0);
    if ((int)uVar7 < (int)uVar5) {
      s = 1;
      do {
        expand(this,s);
        this->_array[s - 1] = (int)uVar6;
        uVar7 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar7;
        s = s + 1;
      } while (uVar5 != uVar7);
    }
  }
  else {
    ensure(this,count);
    auVar4 = _DAT_00871040;
    auVar3 = _DAT_00871030;
    auVar2 = _DAT_00871020;
    if ((int)uVar7 < (int)uVar5) {
      piVar1 = this->_array;
      uVar5 = ~uVar7 + uVar5;
      auVar8._4_4_ = 0;
      auVar8._0_4_ = uVar5;
      auVar8._8_4_ = uVar5;
      auVar8._12_4_ = 0;
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_00871040;
      do {
        iVar10 = (int)uVar6;
        auVar11._8_4_ = iVar10;
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = (int)(uVar6 >> 0x20);
        auVar12 = (auVar11 | auVar3) ^ auVar4;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_
                    ) & 1)) {
          piVar1[uVar6] = uVar7 + iVar10;
        }
        if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
            auVar12._12_4_ <= auVar8._12_4_) {
          piVar1[uVar6 + 1] = uVar7 + iVar10 + 1;
        }
        auVar11 = (auVar11 | auVar2) ^ auVar4;
        iVar13 = auVar11._4_4_;
        if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar11._0_4_ <= auVar8._0_4_)) {
          piVar1[uVar6 + 2] = uVar7 + iVar10 + 2;
          piVar1[uVar6 + 3] = uVar7 + iVar10 + 3;
        }
        uVar6 = uVar6 + 4;
      } while (((ulong)uVar5 + 4 & 0xfffffffffffffffc) != uVar6);
    }
  }
  return;
}

Assistant:

void initFromIterator(It it, size_t count=0) {
    if(count) {
      ensure(count);
      C* ptr=_array;
      while(it.hasNext()) {
	*(ptr++)=it.next();
      }
    } else {
      ensure(0);
      count=0;
      while(it.hasNext()) {
	expand(++count);
	(*this)[count-1]=it.next();
      }
    }
  }